

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_function-c.cpp
# Opt level: O2

bool duckdb::CAPICastFunction(Vector *input,Vector *output,idx_t count,CastParameters *parameters)

{
  VectorType VVar1;
  char cVar2;
  BoundCastData *pBVar3;
  CCastExecuteInfo exec_info;
  
  VVar1 = input->vector_type;
  Vector::Flatten(input,count);
  exec_info.error_message._M_dataplus._M_p = (pointer)&exec_info.error_message.field_2;
  exec_info.error_message._M_string_length = 0;
  exec_info.error_message.field_2._M_local_buf[0] = '\0';
  exec_info.parameters = parameters;
  pBVar3 = optional_ptr<duckdb::BoundCastData,_true>::operator->(&parameters->cast_data);
  cVar2 = (*(code *)pBVar3[1]._vptr_BoundCastData)(&exec_info,count,input,output);
  if (cVar2 == '\0') {
    HandleCastError::AssignError(&exec_info.error_message,parameters);
    if ((count != 1 || VVar1 != CONSTANT_VECTOR) || (parameters->strict != false))
    goto LAB_01a34612;
  }
  else if (count != 1 || VVar1 != CONSTANT_VECTOR) goto LAB_01a34612;
  Vector::SetVectorType(output,CONSTANT_VECTOR);
LAB_01a34612:
  ::std::__cxx11::string::~string((string *)&exec_info.error_message);
  return (bool)cVar2;
}

Assistant:

static bool CAPICastFunction(Vector &input, Vector &output, idx_t count, CastParameters &parameters) {

	const auto is_const = input.GetVectorType() == VectorType::CONSTANT_VECTOR;
	input.Flatten(count);

	CCastExecuteInfo exec_info(parameters);
	const auto &data = parameters.cast_data->Cast<CCastFunctionData>();

	auto c_input = reinterpret_cast<duckdb_vector>(&input);
	auto c_output = reinterpret_cast<duckdb_vector>(&output);
	auto c_info = reinterpret_cast<duckdb_function_info>(&exec_info);

	const auto success = data.function(c_info, count, c_input, c_output);

	if (!success) {
		HandleCastError::AssignError(exec_info.error_message, parameters);
	}

	if (is_const && count == 1 && (success || !parameters.strict)) {
		output.SetVectorType(VectorType::CONSTANT_VECTOR);
	}

	return success;
}